

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.cpp
# Opt level: O1

void boost::deflate::inflate_stream_test::testFixedHuffmanFlushTrees(IDecompressor *d)

{
  long *plVar1;
  int iVar2;
  uint extraout_var;
  uint extraout_var_00;
  undefined4 extraout_var_01;
  string out;
  long *local_48;
  undefined8 local_40;
  long local_38 [2];
  undefined8 local_23;
  undefined2 local_1b;
  undefined1 local_19;
  
  local_48 = local_38;
  std::__cxx11::string::_M_construct((ulong)&local_48,'\x05');
  (**d->_vptr_IDecompressor)(d);
  local_23 = 0x7c9c9cd48f2;
  local_1b = 0xff00;
  local_19 = 0xff;
  (*d->_vptr_IDecompressor[5])(d);
  (*d->_vptr_IDecompressor[9])(d,local_48);
  (*d->_vptr_IDecompressor[3])(d,0xb);
  (*d->_vptr_IDecompressor[7])(d,local_40);
  (*d->_vptr_IDecompressor[10])(d,6);
  (**(code **)(*test_suite::detail::current()::p + 0x28 + (ulong)(extraout_var & 1) * 8))
            (test_suite::detail::current()::p,"!ec",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/inflate_stream.cpp"
             ,0x294,
             "static void boost::deflate::inflate_stream_test::testFixedHuffmanFlushTrees(IDecompressor &)"
            );
  (*d->_vptr_IDecompressor[10])(d,3);
  (**(code **)(*test_suite::detail::current()::p + 0x28 + (ulong)((extraout_var_00 & 1) != 0) * 8))
            (test_suite::detail::current()::p,"!ec",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/inflate_stream.cpp"
             ,0x296,
             "static void boost::deflate::inflate_stream_test::testFixedHuffmanFlushTrees(IDecompressor &)"
            );
  plVar1 = test_suite::detail::current()::p;
  iVar2 = (*d->_vptr_IDecompressor[6])(d);
  (**(code **)(*plVar1 + 0x28 + (ulong)(CONCAT44(extraout_var_01,iVar2) != 0) * 8))
            (plVar1,"d.avail_out() == 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/inflate_stream.cpp"
             ,0x297,
             "static void boost::deflate::inflate_stream_test::testFixedHuffmanFlushTrees(IDecompressor &)"
            );
  plVar1 = test_suite::detail::current()::p;
  iVar2 = std::__cxx11::string::compare((char *)&local_48);
  (**(code **)(*plVar1 + 0x28 + (ulong)(iVar2 != 0) * 8))
            (plVar1,"out == \"Hello\"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/inflate_stream.cpp"
             ,0x298,
             "static void boost::deflate::inflate_stream_test::testFixedHuffmanFlushTrees(IDecompressor &)"
            );
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return;
}

Assistant:

static
    void testFixedHuffmanFlushTrees(IDecompressor& d)
    {
        std::string out(5, 0);
        d.init();
        error_code ec;
        std::initializer_list<std::uint8_t> in = {
            0xf2, 0x48, 0xcd, 0xc9, 0xc9, 0x07, 0x00, 0x00,
            0x00, 0xff, 0xff};
        d.next_in(&*in.begin());
        d.next_out(&out[0]);
        d.avail_in(in.size());
        d.avail_out(out.size());
        ec = d.write(Flush::trees);
        BOOST_TEST(!ec);
        ec = d.write(Flush::sync);
        BOOST_TEST(!ec);
        BOOST_TEST(d.avail_out() == 0);
        BOOST_TEST(out == "Hello");
    }